

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::jsonStreamData(Config *this,string *parameter)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_39;
  string local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *parameter_local;
  Config *this_local;
  
  local_18 = parameter;
  parameter_local = (string *)this;
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  peVar2->json_stream_data_set = true;
  bVar1 = std::operator==(local_18,"none");
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->o);
    peVar2->json_stream_data = qpdf_sj_none;
  }
  else {
    bVar1 = std::operator==(local_18,"inline");
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
      peVar2->json_stream_data = qpdf_sj_inline;
    }
    else {
      bVar1 = std::operator==(local_18,"file");
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
        peVar2->json_stream_data = qpdf_sj_file;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"invalid json-streams option",&local_39);
        usage(&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator(&local_39);
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::jsonStreamData(std::string const& parameter)
{
    o.m->json_stream_data_set = true;
    if (parameter == "none") {
        o.m->json_stream_data = qpdf_sj_none;
    } else if (parameter == "inline") {
        o.m->json_stream_data = qpdf_sj_inline;
    } else if (parameter == "file") {
        o.m->json_stream_data = qpdf_sj_file;
    } else {
        usage("invalid json-streams option");
    }

    return this;
}